

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amrex_parser.lex.cpp
# Opt level: O0

void amrex_parser_init_buffer(YY_BUFFER_STATE b,FILE *file)

{
  int *piVar1;
  FILE *in_RSI;
  YY_BUFFER_STATE in_RDI;
  int oerrno;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  YY_BUFFER_STATE local_28;
  
  piVar1 = __errno_location();
  iVar2 = *piVar1;
  amrex_parser_flush_buffer
            ((YY_BUFFER_STATE)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI->yy_input_file = in_RSI;
  in_RDI->yy_fill_buffer = 1;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_28 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_28 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (in_RDI != local_28) {
    in_RDI->yy_bs_lineno = 1;
    in_RDI->yy_bs_column = 0;
  }
  in_RDI->yy_is_interactive = 0;
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  return;
}

Assistant:

static void yy_init_buffer  (YY_BUFFER_STATE  b, FILE * file )

{
	int oerrno = errno;
    
	yy_flush_buffer( b );

	b->yy_input_file = file;
	b->yy_fill_buffer = 1;

    /* If b is the current buffer, then yy_init_buffer was _probably_
     * called from yyrestart() or through yy_get_next_buffer.
     * In that case, we don't want to reset the lineno or column.
     */
    if (b != YY_CURRENT_BUFFER){
        b->yy_bs_lineno = 1;
        b->yy_bs_column = 0;
    }

        b->yy_is_interactive = 0;
    
	errno = oerrno;
}